

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

void sym_set_global(int pass,char *id)

{
  int iVar1;
  char *in_RSI;
  int in_EDI;
  sym_t *psym;
  sym_t *local_18;
  
  if (in_EDI != 1) {
    local_18 = root;
    while ((local_18 != (sym_t *)0x0 && (iVar1 = strcmp(local_18->id,in_RSI), iVar1 != 0))) {
      local_18 = local_18->next;
    }
    if (local_18 == (sym_t *)0x0) {
      err(E,"symbol \'%s\' declared global but not defined",in_RSI);
    }
    else if (local_18->type == _extern) {
      err(E,"symbol \'%s\' declared global but not defined",in_RSI);
    }
    else {
      if (local_18->type == _global) {
        err(W,"symbol \'%s\' declared global more than once",in_RSI);
      }
      local_18->type = _global;
    }
  }
  return;
}

Assistant:

void sym_set_global(int pass, char* id)
{
    sym_t* psym;
    if (pass == READ_PASS)
        return;

    psym = root;
    while (psym)
    {
        if (strcmp(psym->id, id) == 0)
            break;
        psym = psym->next;
    }
    
    if (psym == NULL)
    {
        err(E, "symbol '%s' declared global but not defined", id);
        return;
    }
    
    if (psym->type == _extern)
    {
        err(E, "symbol '%s' declared global but not defined", id);
        return;
    }
    
    if (psym->type == _global)
        err(W, "symbol '%s' declared global more than once", id);
    
    psym->type = _global;
}